

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O0

void childafterfork(void)

{
  int iVar1;
  vector<SMTMap_*,_std::allocator<SMTMap_*>_> *this;
  SMTMap *this_00;
  long *in_FS_OFFSET;
  SMTMap *local_10;
  SMTMap *globalmap;
  
  printf("In a forked child, let\'s clean mmap and mutex\n");
  pthread_mutex_unlock((pthread_mutex_t *)&maplock);
  pthread_mutex_destroy((pthread_mutex_t *)&maplock);
  iVar1 = pthread_mutex_init((pthread_mutex_t *)&maplock,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    printf("fail to init mutex\n");
    exit(1);
  }
  *(undefined4 *)(*in_FS_OFFSET + -8) = 1;
  this = (vector<SMTMap_*,_std::allocator<SMTMap_*>_> *)operator_new(0x18);
  memset(this,0,0x18);
  std::vector<SMTMap_*,_std::allocator<SMTMap_*>_>::vector(this);
  smtmaplist = this;
  if (this == (vector<SMTMap_*,_std::allocator<SMTMap_*>_> *)0x0) {
    printf("fail to new mmap\n");
    exit(1);
  }
  this_00 = (SMTMap *)operator_new(0x440);
  SMTMap::SMTMap(this_00,"before main()","main()",0);
  local_10 = this_00;
  if (this_00 != (SMTMap *)0x0) {
    SMTMap::stopAt(this_00,"after main()","main()",0);
    std::vector<SMTMap_*,_std::allocator<SMTMap_*>_>::push_back(smtmaplist,&local_10);
  }
  *(undefined4 *)(*in_FS_OFFSET + -8) = 0;
  printf("child process after fork callback done\n");
  return;
}

Assistant:

static void childafterfork()
{
    SMTLOG("In a forked child, let's clean mmap and mutex\n");
    pthread_mutex_unlock(&maplock);
    pthread_mutex_destroy(&maplock);
    if (pthread_mutex_init(&maplock, 0)) {
        SMTLOG("fail to init mutex\n");
        exit(1);
    }
    use_origin_malloc = 1;
    smtmaplist = new std::vector<SMTMap*>();
    if (!smtmaplist) {
        SMTLOG("fail to new mmap\n");
        exit(1);
    }
    SMTMap* globalmap = new SMTMap("before main()", "main()", 0);
    if (globalmap) {
        globalmap->stopAt("after main()", "main()", 0);
        smtmaplist->push_back(globalmap);
    }
    use_origin_malloc = 0;
	SMTLOG("child process after fork callback done\n");
}